

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::XThreadPaf::destroy(XThreadPaf *this)

{
  Impl *pIVar1;
  bool bVar2;
  Mutex *local_60;
  Maybe<kj::_::Mutex::Waiter_&> local_58;
  anon_class_8_1_8991fb9c local_50;
  undefined1 local_48;
  PredicateImpl impl;
  
  if (this->state != DISPATCHED) {
    LOCK();
    bVar2 = this->state == WAITING;
    if (bVar2) {
      this->state = CANCELED;
    }
    UNLOCK();
    if (!bVar2) {
      pIVar1 = (((this->executor).ptr)->impl).ptr;
      local_50.this = this;
      MutexGuarded<kj::Executor::Impl::State>::lockExclusive
                ((MutexGuarded<kj::Executor::Impl::State> *)&stack0xffffffffffffffa0,pIVar1);
      impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_00673878;
      impl.value = (State *)local_58.ptr;
      local_48 = 0;
      impl.condition = &stack0xffffffffffffffb0;
      Mutex::wait(local_60,&impl);
      if (this->state == FULFILLED) {
        List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::remove
                  (&(pIVar1->state).value.fulfilled,(char *)this);
      }
      Locked<kj::Executor::Impl::State>::~Locked
                ((Locked<kj::Executor::Impl::State> *)&stack0xffffffffffffffa0);
      (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[6])(this);
    }
    return;
  }
  (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[6])(this);
  return;
}

Assistant:

void XThreadPaf::destroy() {
  auto oldState = WAITING;

  if (__atomic_load_n(&state, __ATOMIC_ACQUIRE) == DISPATCHED) {
    // Common case: Promise was fully fulfilled and dispatched, no need for locking.
    delete this;
  } else if (__atomic_compare_exchange_n(&state, &oldState, CANCELED, false,
                                         __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
    // State transitioned from WAITING to CANCELED, so now it's the fulfiller's job to destroy the
    // object.
  } else {
    // Whoops, another thread is already in the process of fulfilling this promise. We'll have to
    // wait for it to finish and transition the state to FULFILLED.
    executor->impl->state.when([&](auto&) {
      return state == FULFILLED || state == DISPATCHED;
    }, [&](Executor::Impl::State& exState) {
      if (state == FULFILLED) {
        // The object is on the queue but was not yet dispatched. Remove it.
        exState.fulfilled.remove(*this);
      }
    });

    // It's ours now, delete it.
    delete this;
  }
}